

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Gen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_58;
  int fVerbose;
  int c;
  int fXor;
  int Multi;
  int nBestTries;
  int Limit;
  int nLevels;
  int nLuts;
  int LutSize;
  int Algo;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nLuts = 0;
  nLevels = 6;
  Limit = 0x100;
  nBestTries = 8;
  Multi = 0;
  fXor = 1;
  c = 0;
  fVerbose = 1;
  local_58 = 0;
  Extra_UtilGetoptReset();
LAB_002c6f71:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"AKNDLBMxvh");
    if (iVar1 == -1) {
      pNew = Extra_CommandGen(nLuts,nLevels,Limit,nBestTries,Multi,fXor,c,fVerbose,local_58);
      Abc_FrameUpdateGia(pAbc,pNew);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      nLuts = atoi(argv[globalUtilOptind]);
      iVar1 = nLuts;
      break;
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      fXor = atoi(argv[globalUtilOptind]);
      iVar1 = fXor;
      break;
    default:
      goto LAB_002c72e0;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      nBestTries = atoi(argv[globalUtilOptind]);
      iVar1 = nBestTries;
      break;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      nLevels = atoi(argv[globalUtilOptind]);
      iVar1 = nLevels;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      Multi = atoi(argv[globalUtilOptind]);
      iVar1 = Multi;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002c72e0;
      }
      Limit = atoi(argv[globalUtilOptind]);
      iVar1 = Limit;
      break;
    case 0x68:
      goto LAB_002c72e0;
    case 0x76:
      local_58 = local_58 ^ 1;
      goto LAB_002c6f71;
    case 0x78:
      fVerbose = fVerbose ^ 1;
      goto LAB_002c6f71;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002c72e0:
      Abc_Print(-2,"usage: &gen [-AKNDLBMxvh]\n");
      Abc_Print(-2,"\t          generates network\n");
      Abc_Print(-2,"\t-A num  : the generation algorithm [default = %d]\n",(ulong)(uint)nLuts);
      Abc_Print(-2,"\t-K num  : the number of LUT inputs [default = %d]\n",(ulong)(uint)nLevels);
      Abc_Print(-2,"\t-N num  : the number of LUTs on one level [default = %d]\n",(ulong)(uint)Limit
               );
      Abc_Print(-2,"\t-D num  : the number of LUT levels [default = %d]\n",(ulong)(uint)nBestTries);
      Abc_Print(-2,"\t-L num  : limit below which we randomize [default = %d]\n",(ulong)(uint)Multi)
      ;
      Abc_Print(-2,"\t-B num  : select best fanins among this many tries [default = %d]\n",
                (ulong)(uint)fXor);
      Abc_Print(-2,"\t-M num  : the multiplier type (1=array, 2=booth) [default = %d]\n",
                (ulong)(uint)c);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-x      : toggle using XOR gates [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_58 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v      : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Gen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Extra_CommandGen( int Algo, int LutSize, int nLuts, int nLevels, int Limit, int nBestTries, int Multi, int fXor, int fVerbose );
    Gia_Man_t * pTemp = NULL;
    int Algo        =   0;
    int LutSize     =   6;
    int nLuts       = 256;
    int nLevels     =   8;
    int Limit       =   0;
    int nBestTries  =   1;
    int Multi       =   0;
    int fXor        =   1;
    int c, fVerbose =   0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AKNDLBMxvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Algo < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            LutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LutSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nLuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLuts < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevels = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevels < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            nBestTries = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBestTries < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            Multi = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Multi < 0 )
                goto usage;
            break;
        case 'x':
            fXor ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pTemp = Extra_CommandGen( Algo, LutSize, nLuts, nLevels, Limit, nBestTries, Multi, fXor, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &gen [-AKNDLBMxvh]\n" );
    Abc_Print( -2, "\t          generates network\n" );
    Abc_Print( -2, "\t-A num  : the generation algorithm [default = %d]\n",                 Algo );
    Abc_Print( -2, "\t-K num  : the number of LUT inputs [default = %d]\n",                 LutSize );
    Abc_Print( -2, "\t-N num  : the number of LUTs on one level [default = %d]\n",          nLuts );
    Abc_Print( -2, "\t-D num  : the number of LUT levels [default = %d]\n",                 nLevels );
    Abc_Print( -2, "\t-L num  : limit below which we randomize [default = %d]\n",           Limit );
    Abc_Print( -2, "\t-B num  : select best fanins among this many tries [default = %d]\n", nBestTries );
    Abc_Print( -2, "\t-M num  : the multiplier type (1=array, 2=booth) [default = %d]\n",   Multi );
    Abc_Print( -2, "\t-x      : toggle using XOR gates [default = %s]\n",                   fXor? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggle printing verbose information [default = %s]\n",      fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}